

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi_uc sVar2;
  stbi__context *s;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  stbi_uc sVar8;
  int iVar9;
  stbi__uint32 sVar10;
  stbi__uint32 sVar11;
  int iVar12;
  int depth;
  int iVar13;
  size_t __size;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  uint uVar16;
  long lVar17;
  stbi_uc *psVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ushort uVar24;
  uint uVar25;
  uint y;
  int out_n;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  uint color;
  size_t sVar30;
  bool bVar31;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 local_47c;
  stbi__uint32 raw_len;
  ulong local_450;
  ulong local_448;
  stbi_uc *local_440;
  stbi_uc palette [1024];
  
  s = z->s;
  z->out = (stbi_uc *)0x0;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar31 = true;
  bVar6 = 0;
  color = 0;
  bVar4 = false;
  uVar26 = 0;
  uVar20 = 0;
  bVar19 = 0;
  uVar29 = 0;
  bVar5 = false;
  do {
    sVar10 = stbi__get32be(s);
    sVar30 = (size_t)sVar10;
    sVar11 = stbi__get32be(s);
    if (sVar11 == 0x43674249) {
      bVar4 = true;
LAB_00109860:
      stbi__skip(s,sVar10);
    }
    else if (sVar11 == 0x49444154) {
      if (bVar31) goto LAB_00109b37;
      if ((bVar19 != 0) && (uVar26 == 0)) {
        stbi__g_failure_reason = "no PLTE";
        return 0;
      }
      if (scan == 2) {
        s->img_n = (uint)bVar19;
        return 1;
      }
      uVar27 = sVar10 + uVar29;
      if ((int)uVar27 < (int)uVar29) {
        return 0;
      }
      if (uVar20 < uVar27) {
        if (sVar10 < 0x1001) {
          sVar30 = 0x1000;
        }
        if (uVar20 != 0) {
          sVar30 = (ulong)uVar20;
        }
        do {
          __size = sVar30;
          uVar20 = (uint)__size;
          sVar30 = (ulong)(uVar20 * 2);
        } while (uVar20 < uVar27);
        psVar14 = (stbi_uc *)realloc(*ppsVar1,__size);
        if (psVar14 == (stbi_uc *)0x0) goto LAB_0010a1d6;
        *ppsVar1 = psVar14;
      }
      else {
        psVar14 = *ppsVar1;
      }
      iVar9 = stbi__getn(s,psVar14 + uVar29,sVar10);
      if (iVar9 == 0) {
        stbi__g_failure_reason = "outofdata";
        return 0;
      }
      bVar31 = false;
      uVar29 = uVar27;
    }
    else if (sVar11 == 0x49484452) {
      if (!bVar31) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (sVar10 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      sVar10 = stbi__get32be(s);
      s->img_x = sVar10;
      if (0x1000000 < sVar10) {
LAB_00109b0a:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      sVar10 = stbi__get32be(s);
      s->img_y = sVar10;
      if (0x1000000 < sVar10) goto LAB_00109b0a;
      bVar6 = stbi__get8(s);
      z->depth = (uint)bVar6;
      if ((0x10 < bVar6) || ((0x10116U >> (bVar6 & 0x1f) & 1) == 0)) {
        stbi__g_failure_reason = "1/2/4/8/16-bit only";
        return 0;
      }
      bVar7 = stbi__get8(s);
      if (6 < bVar7) {
LAB_00109b1c:
        stbi__g_failure_reason = "bad ctype";
        return 0;
      }
      color = (uint)bVar7;
      if (bVar7 == 3) {
        bVar19 = 3;
        if (z->depth == 0x10) goto LAB_00109b1c;
      }
      else if ((bVar7 & 1) != 0) goto LAB_00109b1c;
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        stbi__g_failure_reason = "bad comp method";
        return 0;
      }
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar6 = stbi__get8(s);
      if (1 < bVar6) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar27 = s->img_x;
      if ((uVar27 == 0) || (uVar16 = s->img_y, uVar16 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      if (bVar19 == 0) {
        uVar22 = (3 < bVar7) + 1 + (bVar7 & 2);
        s->img_n = uVar22;
        if ((uint)((0x40000000 / (ulong)uVar27) / (ulong)uVar22) < uVar16) goto LAB_00109b0a;
        bVar31 = false;
        bVar19 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar31 = false;
        if ((uint)(0x40000000 / (ulong)uVar27 >> 2) < uVar16) goto LAB_00109b0a;
      }
    }
    else if (sVar11 == 0x504c5445) {
      if (bVar31) goto LAB_00109b37;
      if ((0x300 < sVar10) || (uVar26 = (sVar10 & 0xffff) / 3, uVar26 * 3 != sVar10)) {
        stbi__g_failure_reason = "invalid PLTE";
        return 0;
      }
      for (uVar21 = 0; uVar26 != uVar21; uVar21 = uVar21 + 1) {
        sVar8 = stbi__get8(s);
        palette[uVar21 * 4] = sVar8;
        sVar8 = stbi__get8(s);
        palette[uVar21 * 4 + 1] = sVar8;
        sVar8 = stbi__get8(s);
        palette[uVar21 * 4 + 2] = sVar8;
        palette[uVar21 * 4 + 3] = 0xff;
      }
      bVar31 = false;
    }
    else {
      if (sVar11 != 0x74524e53) {
        if (sVar11 != 0x49454e44) {
          if (bVar31) goto LAB_00109b37;
          bVar31 = false;
          if ((sVar11 >> 0x1d & 1) == 0) {
            stbi__parse_png_file::invalid_chunk._0_4_ = swap_bytes(sVar11);
            stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
            return 0;
          }
          goto LAB_00109860;
        }
        if (bVar31) {
LAB_00109b37:
          stbi__g_failure_reason = "first not IHDR";
          return 0;
        }
        if (scan != 0) {
          return 1;
        }
        if (*ppsVar1 == (stbi_uc *)0x0) {
          stbi__g_failure_reason = "no IDAT";
          return 0;
        }
        raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
        psVar14 = (stbi_uc *)
                  stbi_zlib_decode_malloc_guesssize_headerflag
                            ((char *)*ppsVar1,uVar29,raw_len,(int *)&raw_len,(uint)!bVar4);
        z->expanded = psVar14;
        if (psVar14 == (stbi_uc *)0x0) {
          return 0;
        }
        free(z->idata);
        z->idata = (stbi_uc *)0x0;
        iVar9 = s->img_n + 1;
        iVar12 = s->img_n;
        if (bVar5) {
          iVar12 = iVar9;
        }
        out_n = iVar12;
        if (req_comp != 3) {
          out_n = iVar9;
        }
        if (bVar19 != 0) {
          out_n = iVar12;
        }
        if (iVar9 != req_comp) {
          out_n = iVar12;
        }
        s->img_out_n = out_n;
        uVar26 = z->depth;
        local_450 = (ulong)uVar26;
        psVar14 = z->expanded;
        sVar10 = z->s->img_x;
        sVar11 = z->s->img_y;
        if (bVar6 == 0) {
          iVar9 = stbi__create_png_image_raw(z,psVar14,raw_len,out_n,sVar10,sVar11,uVar26,color);
          if (iVar9 == 0) {
            return 0;
          }
        }
        else {
          iVar9 = out_n << (uVar26 == 0x10);
          local_47c = raw_len;
          psVar15 = (stbi_uc *)stbi__malloc_mad3(sVar10,sVar11,iVar9,0);
          sVar30 = (size_t)iVar9;
          for (uVar21 = (ulong)(uint)(0 << (uVar26 == 0x10)); uVar21 != 7; uVar21 = uVar21 + 1) {
            uVar26 = (&DAT_0010d300)[uVar21];
            psVar3 = z->s;
            uVar29 = (&DAT_0010d340)[uVar21];
            uVar22 = ~uVar26 + psVar3->img_x + uVar29;
            uVar16 = uVar22 / uVar29;
            uVar20 = (&DAT_0010d320)[uVar21];
            uVar27 = (&DAT_0010d360)[uVar21];
            uVar25 = ~uVar20 + psVar3->img_y + uVar27;
            y = uVar25 / uVar27;
            if ((uVar29 <= uVar22) && (uVar27 <= uVar25)) {
              depth = (int)local_450;
              iVar12 = psVar3->img_n;
              iVar13 = stbi__create_png_image_raw(z,psVar14,local_47c,out_n,uVar16,y,depth,color);
              if (iVar13 == 0) {
                free(psVar15);
                return 0;
              }
              iVar13 = uVar20 * iVar9;
              uVar20 = (((int)(uVar16 * depth * iVar12 + 7) >> 3) + 1) * y;
              local_448 = uVar21;
              local_440 = psVar14;
              for (lVar17 = 0; lVar17 < (int)y; lVar17 = lVar17 + 1) {
                psVar14 = psVar15 + (long)(int)uVar26 * sVar30;
                for (lVar28 = 0; lVar28 < (int)uVar16; lVar28 = lVar28 + 1) {
                  memcpy(psVar14 + z->s->img_x * iVar13,
                         z->out + (lVar28 + lVar17 * (int)uVar16) * sVar30,sVar30);
                  psVar14 = psVar14 + (long)(int)uVar29 * sVar30;
                }
                iVar13 = iVar13 + uVar27 * iVar9;
              }
              free(z->out);
              local_47c = local_47c - uVar20;
              psVar14 = local_440 + uVar20;
              uVar21 = local_448;
            }
          }
          z->out = psVar15;
        }
        if (bVar5) {
          psVar14 = z->out;
          iVar9 = z->s->img_y * z->s->img_x;
          if (z->depth == 0x10) {
            if (s->img_out_n == 2) {
              for (lVar17 = 0; iVar9 != (int)lVar17; lVar17 = lVar17 + 1) {
                *(ushort *)(psVar14 + lVar17 * 4 + 2) =
                     -(ushort)(*(stbi__uint16 *)(psVar14 + lVar17 * 4) != tc16[0]);
              }
            }
            else {
              for (lVar17 = 0; iVar9 != (int)lVar17; lVar17 = lVar17 + 1) {
                if (((*(stbi__uint16 *)(psVar14 + lVar17 * 8) == tc16[0]) &&
                    (*(stbi__uint16 *)(psVar14 + lVar17 * 8 + 2) == tc16[1])) &&
                   (*(stbi__uint16 *)(psVar14 + lVar17 * 8 + 4) == tc16[2])) {
                  (psVar14 + lVar17 * 8 + 6)[0] = '\0';
                  (psVar14 + lVar17 * 8 + 6)[1] = '\0';
                }
              }
            }
          }
          else if (s->img_out_n == 2) {
            for (lVar17 = 0; iVar9 != (int)lVar17; lVar17 = lVar17 + 1) {
              psVar14[lVar17 * 2 + 1] = -(psVar14[lVar17 * 2] != tc[0]);
            }
          }
          else {
            for (lVar17 = 0; iVar9 != (int)lVar17; lVar17 = lVar17 + 1) {
              if (((psVar14[lVar17 * 4] == tc[0]) && (psVar14[lVar17 * 4 + 1] == tc[1])) &&
                 (psVar14[lVar17 * 4 + 2] == tc[2])) {
                psVar14[lVar17 * 4 + 3] = '\0';
              }
            }
          }
        }
        if (((bVar4) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
          psVar3 = z->s;
          psVar14 = z->out;
          iVar9 = psVar3->img_y * psVar3->img_x;
          if (psVar3->img_out_n == 3) {
            while (bVar31 = iVar9 != 0, iVar9 = iVar9 + -1, bVar31) {
              sVar8 = *psVar14;
              *psVar14 = psVar14[2];
              psVar14[2] = sVar8;
              psVar14 = psVar14 + 3;
            }
          }
          else if (stbi__unpremultiply_on_load == 0) {
            for (lVar17 = 0; iVar9 != (int)lVar17; lVar17 = lVar17 + 1) {
              sVar8 = psVar14[lVar17 * 4];
              psVar14[lVar17 * 4] = psVar14[lVar17 * 4 + 2];
              psVar14[lVar17 * 4 + 2] = sVar8;
            }
          }
          else {
            for (lVar17 = 0; iVar9 != (int)lVar17; lVar17 = lVar17 + 1) {
              bVar6 = psVar14[lVar17 * 4 + 3];
              bVar7 = psVar14[lVar17 * 4];
              if (bVar6 == 0) {
                psVar14[lVar17 * 4] = psVar14[lVar17 * 4 + 2];
                psVar14[lVar17 * 4 + 2] = bVar7;
              }
              else {
                uVar26 = (uint)(bVar6 >> 1);
                uVar24 = (ushort)bVar6;
                psVar14[lVar17 * 4] =
                     (stbi_uc)(((uint)psVar14[lVar17 * 4 + 2] * 0xff + uVar26 & 0xffff) /
                              (uint)uVar24);
                psVar14[lVar17 * 4 + 1] =
                     (stbi_uc)(((uint)psVar14[lVar17 * 4 + 1] * 0xff + uVar26 & 0xffff) /
                              (uint)uVar24);
                psVar14[lVar17 * 4 + 2] =
                     (stbi_uc)(((uint)bVar7 * 0xff + uVar26 & 0xffff) / (uint)uVar24);
              }
            }
          }
        }
        if (bVar19 == 0) {
          if (bVar5) {
            s->img_n = s->img_n + 1;
          }
        }
        else {
          s->img_n = (uint)bVar19;
          uVar26 = (uint)bVar19;
          if (2 < req_comp) {
            uVar26 = req_comp;
          }
          s->img_out_n = uVar26;
          psVar14 = z->out;
          uVar29 = z->s->img_y * z->s->img_x;
          psVar15 = (stbi_uc *)stbi__malloc_mad2(uVar29,uVar26,0);
          if (psVar15 == (stbi_uc *)0x0) {
LAB_0010a1d6:
            stbi__g_failure_reason = "outofmem";
            return 0;
          }
          uVar21 = 0;
          psVar18 = psVar15;
          if (uVar26 == 3) {
            for (; uVar29 != uVar21; uVar21 = uVar21 + 1) {
              uVar23 = (ulong)psVar14[uVar21];
              sVar8 = palette[uVar23 * 4 + 1];
              sVar2 = palette[uVar23 * 4 + 2];
              *psVar18 = palette[uVar23 * 4];
              psVar18[1] = sVar8;
              psVar18[2] = sVar2;
              psVar18 = psVar18 + 3;
            }
          }
          else {
            for (; uVar29 != uVar21; uVar21 = uVar21 + 1) {
              *(undefined4 *)(psVar15 + uVar21 * 4) =
                   *(undefined4 *)(palette + (ulong)psVar14[uVar21] * 4);
            }
          }
          free(psVar14);
          z->out = psVar15;
        }
        free(z->expanded);
        z->expanded = (stbi_uc *)0x0;
        return 1;
      }
      if (bVar31) goto LAB_00109b37;
      if (*ppsVar1 != (stbi_uc *)0x0) {
        stbi__g_failure_reason = "tRNS after IDAT";
        return 0;
      }
      if (bVar19 == 0) {
        uVar27 = s->img_n;
        if ((uVar27 & 1) == 0) {
          stbi__g_failure_reason = "tRNS with alpha";
          return 0;
        }
        if (uVar27 * 2 != sVar10) {
LAB_00109ba3:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        if (z->depth == 0x10) {
          for (lVar17 = 0; lVar17 < (int)uVar27; lVar17 = lVar17 + 1) {
            iVar9 = stbi__get16be(s);
            tc16[lVar17] = (stbi__uint16)iVar9;
            uVar27 = s->img_n;
          }
        }
        else {
          for (lVar17 = 0; lVar17 < (int)uVar27; lVar17 = lVar17 + 1) {
            iVar9 = stbi__get16be(s);
            tc[lVar17] = ""[z->depth] * (char)iVar9;
            uVar27 = s->img_n;
          }
        }
        bVar5 = true;
        bVar31 = false;
        bVar19 = 0;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar26 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (uVar26 < sVar10) goto LAB_00109ba3;
        for (uVar21 = 0; sVar30 != uVar21; uVar21 = uVar21 + 1) {
          sVar8 = stbi__get8(s);
          palette[uVar21 * 4 + 3] = sVar8;
        }
        bVar19 = 4;
        bVar31 = false;
      }
    }
    stbi__get32be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}